

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O1

void __thiscall gutil::Parameter::printHelp(Parameter *this,ostream *out,size_t columns)

{
  ulong uVar1;
  string *psVar2;
  ostream *poVar3;
  size_type sVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pbVar7;
  long lVar8;
  pointer pbVar9;
  _Alloc_hider _Var10;
  ulong uVar11;
  string descr;
  string val;
  string val_1;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  sVar4 = (this->creat)._M_string_length;
  if (sVar4 != 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(this->creat)._M_dataplus._M_p,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  pbVar9 = (this->def).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->def).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pbVar9) {
    uVar6 = 1;
  }
  else {
    lVar8 = 0;
    uVar11 = 0;
    uVar6 = 0;
    do {
      anon_unknown_4::getValue(&local_b0,(string *)((long)&(pbVar9->_M_dataplus)._M_p + lVar8));
      sVar4 = local_b0._M_string_length;
      if ((local_b0._M_string_length != 0) &&
         (*(char *)CONCAT71(local_b0._M_dataplus._M_p._1_7_,local_b0._M_dataplus._M_p._0_1_) == '<')
         ) {
        sVar4 = local_b0._M_string_length +
                (**(char **)((long)&(((this->def).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar8) == ' ');
      }
      if (uVar6 <= sVar4) {
        uVar6 = sVar4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_b0._M_dataplus._M_p._1_7_,local_b0._M_dataplus._M_p._0_1_) !=
          &local_b0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_b0._M_dataplus._M_p._1_7_,local_b0._M_dataplus._M_p._0_1_));
      }
      uVar11 = uVar11 + 1;
      pbVar9 = (this->def).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x20;
    } while (uVar11 < (ulong)((long)(this->def).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5))
    ;
    uVar6 = uVar6 + 1;
  }
  uVar11 = columns >> 1;
  if (uVar6 < columns >> 1) {
    uVar11 = uVar6;
  }
  pbVar9 = (this->def).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->def).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar9) {
    uVar6 = 0;
    do {
      anon_unknown_4::getValue(&local_90,pbVar9 + uVar6);
      pbVar9 = (this->def).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar7 = pbVar9 + uVar6;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      uVar5 = std::__cxx11::string::find((char)pbVar7,0x23);
      if (uVar5 < pbVar9[uVar6]._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)pbVar7);
        std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_b0._M_dataplus._M_p._1_7_,local_b0._M_dataplus._M_p._0_1_) !=
            &local_b0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_b0._M_dataplus._M_p._1_7_,local_b0._M_dataplus._M_p._0_1_))
          ;
        }
      }
      trim(&local_d0);
      if (local_90._M_string_length == 0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_d0._M_dataplus._M_p,
                   local_d0._M_dataplus._M_p + local_d0._M_string_length);
        anon_unknown_4::printDescription(out,&local_50,0,columns);
        psVar2 = &local_50;
        _Var10._M_p = local_50._M_dataplus._M_p;
      }
      else {
        if ((*local_90._M_dataplus._M_p == '-') ||
           (*(this->def).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_dataplus._M_p != ' ')) {
          lVar8 = 0;
        }
        else {
          lVar8 = 2;
          std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,local_90._M_dataplus._M_p,local_90._M_string_length);
        uVar5 = lVar8 + local_90._M_string_length;
        uVar1 = uVar5;
        for (; uVar5 < uVar11; uVar5 = uVar5 + 1) {
          local_b0._M_dataplus._M_p._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_b0,1);
          uVar1 = uVar11;
        }
        if (uVar11 < uVar1) {
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
          std::ostream::put((char)out);
          std::ostream::flush();
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_d0._M_dataplus._M_p,
                   local_d0._M_dataplus._M_p + local_d0._M_string_length);
        anon_unknown_4::printDescription(out,&local_70,uVar11,columns);
        psVar2 = &local_70;
        _Var10._M_p = local_70._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var10._M_p != &psVar2->field_2) {
        operator_delete(_Var10._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      uVar6 = uVar6 + 1;
      pbVar9 = (this->def).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->def).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5));
  }
  return;
}

Assistant:

void Parameter::printHelp(std::ostream &out, size_t columns)
const
{
  size_t col1=0;

  if (creat.size() > 0)
  {
    out << creat << std::endl;
  }

  for (size_t i=0; i<def.size(); i++)
  {
    std::string val=getValue(def[i]);
    size_t n=val.size();

    if (n > 0 && val[0] == '<' && def[i][0] == ' ')
    {
      n++;
    }

    col1=std::max(col1, n);
  }

  col1++;

  if (col1 > columns/2)
  {
    col1=columns/2;
  }

  for (size_t i=0; i<def.size(); i++)
  {
    std::string val=getValue(def[i]);
    std::string descr=getDescription(def[i]);

    if (val.size() > 0)
    {
      size_t n=0;

      if (val[0] != '-' && def[i][0] == ' ')
      {
        out << "  ";
        n+=2;
      }

      out << val;
      n+=val.length();

      while (n < col1)
      {
        out << ' ';
        n++;
      }

      if (n > col1)
      {
        out << std::endl;
        n=0;
      }

      printDescription(out, descr, col1, columns);
    }
    else
    {
      printDescription(out, descr, 0, columns);
    }
  }
}